

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * E2toC(Clifford *__return_storage_ptr__,float x,float y)

{
  Blade local_50;
  Blade local_48;
  float local_40;
  float d;
  Blade local_24;
  undefined1 local_19;
  float local_18;
  float local_14;
  float y_local;
  float x_local;
  Clifford *R;
  
  local_19 = 0;
  local_18 = y;
  local_14 = x;
  _y_local = __return_storage_ptr__;
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  Blade::Blade(&local_24,1,local_14);
  std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_24);
  Blade::~Blade(&local_24);
  Blade::Blade((Blade *)&stack0xffffffffffffffc4,2,local_18);
  std::vector<Blade,_std::allocator<Blade>_>::push_back
            (__return_storage_ptr__,(value_type *)&stack0xffffffffffffffc4);
  Blade::~Blade((Blade *)&stack0xffffffffffffffc4);
  local_40 = local_14 * local_14 + local_18 * local_18;
  Blade::Blade(&local_48,8,(local_40 + -1.0) * 0.5);
  std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_48);
  Blade::~Blade(&local_48);
  Blade::Blade(&local_50,0x10,(local_40 + 1.0) * 0.5);
  std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_50);
  Blade::~Blade(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Clifford E2toC(float x, float y)
{
	//e1.insert(e1.begin(),Blade(1,x));
	//e2.insert(e2.begin(),Blade(2,y));
	Clifford R;
	R.push_back(Blade(1,x));
	R.push_back(Blade(2,y));
	float d=(x*x+y*y);
	R.push_back(Blade(8,(d-1.0)/2.0));
	R.push_back(Blade(16,(d+1.0)/2.0));
	return R;
}